

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

lua_Number luaO_arith(int op,lua_Number v1,lua_Number v2)

{
  double dVar1;
  lua_Number v2_local;
  lua_Number v1_local;
  lua_Number lStack_10;
  int op_local;
  
  switch(op) {
  case 0:
    lStack_10 = v1 + v2;
    break;
  case 1:
    lStack_10 = v1 - v2;
    break;
  case 2:
    lStack_10 = v1 * v2;
    break;
  case 3:
    lStack_10 = v1 / v2;
    break;
  case 4:
    dVar1 = floor(v1 / v2);
    lStack_10 = -dVar1 * v2 + v1;
    break;
  case 5:
    lStack_10 = pow(v1,v2);
    break;
  case 6:
    lStack_10 = -v1;
    break;
  default:
    lStack_10 = 0.0;
  }
  return lStack_10;
}

Assistant:

lua_Number luaO_arith (int op, lua_Number v1, lua_Number v2) {
  switch (op) {
    case LUA_OPADD: return luai_numadd(NULL, v1, v2);
    case LUA_OPSUB: return luai_numsub(NULL, v1, v2);
    case LUA_OPMUL: return luai_nummul(NULL, v1, v2);
    case LUA_OPDIV: return luai_numdiv(NULL, v1, v2);
    case LUA_OPMOD: return luai_nummod(NULL, v1, v2);
    case LUA_OPPOW: return luai_numpow(NULL, v1, v2);
    case LUA_OPUNM: return luai_numunm(NULL, v1);
    default: lua_assert(0); return 0;
  }
}